

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_loadi(ASMState *as,Reg r,int32_t i)

{
  MCode *pMVar1;
  MCode MVar2;
  int in_EDX;
  uint in_ESI;
  ASMState *in_RDI;
  MCode rex;
  MCode *p;
  MCode *local_18;
  
  if ((in_EDX == 0) &&
     (((*in_RDI->mcp != '\x0f' || ((in_RDI->mcp[1] & 0xf0) != 0x80)) &&
      ((*in_RDI->mcp & 0xf0) != 0x70)))) {
    emit_rr(in_RDI,0x330000fe,in_ESI,in_ESI);
  }
  else {
    pMVar1 = in_RDI->mcp;
    *(int *)(pMVar1 + -4) = in_EDX;
    pMVar1[-5] = ((byte)in_ESI & 7) + 0xb8;
    local_18 = pMVar1 + -5;
    MVar2 = ((byte)(in_ESI >> 3) & 1) + 0x40;
    if (MVar2 != '@') {
      local_18 = pMVar1 + -6;
      pMVar1[-6] = MVar2;
    }
    in_RDI->mcp = local_18;
  }
  return;
}

Assistant:

static void emit_loadi(ASMState *as, Reg r, int32_t i)
{
  /* XOR r,r is shorter, but modifies the flags. This is bad for HIOP/jcc. */
  if (i == 0 && !(LJ_32 && (IR(as->curins)->o == IR_HIOP ||
			    (as->curins+1 < as->T->nins &&
			     IR(as->curins+1)->o == IR_HIOP))) &&
		!((*as->mcp == 0x0f && (as->mcp[1] & 0xf0) == XI_JCCn) ||
		  (*as->mcp & 0xf0) == XI_JCCs)) {
    emit_rr(as, XO_ARITH(XOg_XOR), r, r);
  } else {
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = i;
    p[-5] = (MCode)(XI_MOVri+(r&7));
    p -= 5;
    REXRB(p, 0, r);
    as->mcp = p;
  }
}